

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

void __thiscall google::protobuf::MessageLite::LogInitializationErrorMessage(MessageLite *this)

{
  LogMessage *other;
  MessageLite *message;
  LogFinisher local_61;
  string local_60;
  LogMessage local_40;
  
  message = (MessageLite *)0x85;
  internal::LogMessage::LogMessage
            (&local_40,LOGLEVEL_ERROR,"third_party/protobuf-lite/message_lite.cc",0x85);
  (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
            (&local_60,(_anonymous_namespace_ *)"parse",(char *)this,message);
  other = internal::LogMessage::operator<<(&local_40,&local_60);
  internal::LogFinisher::operator=(&local_61,other);
  std::__cxx11::string::~string((string *)&local_60);
  internal::LogMessage::~LogMessage(&local_40);
  return;
}

Assistant:

void MessageLite::LogInitializationErrorMessage() const {
  GOOGLE_LOG(ERROR) << InitializationErrorMessage("parse", *this);
}